

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O0

void __thiscall rw::Skin::findUsedBones(Skin *this,int32 numVertices)

{
  int iVar1;
  undefined4 uVar2;
  int local_130;
  int local_12c;
  int32 i_1;
  int32 i;
  float *weights;
  uint8 *indices;
  uint8 usedTab [256];
  int32 numVertices_local;
  Skin *this_local;
  
  weights = (float *)this->indices;
  _i_1 = this->weights;
  usedTab._252_4_ = numVertices;
  memset(&indices,0,0x100);
  while (uVar2 = usedTab._252_4_, usedTab._252_4_ = usedTab._252_4_ + -1, uVar2 != 0) {
    for (local_12c = 0; local_12c < this->numWeights; local_12c = local_12c + 1) {
      if (((_i_1[local_12c] != 0.0) || (NAN(_i_1[local_12c]))) &&
         (usedTab[(ulong)*(byte *)((long)weights + (long)local_12c) - 8] == '\0')) {
        usedTab[(ulong)*(byte *)((long)weights + (long)local_12c) - 8] =
             usedTab[(ulong)*(byte *)((long)weights + (long)local_12c) - 8] + '\x01';
      }
    }
    weights = weights + 1;
    _i_1 = _i_1 + 4;
  }
  this->numUsedBones = 0;
  for (local_130 = 0; local_130 < 0x100; local_130 = local_130 + 1) {
    if (usedTab[(long)local_130 + -8] != '\0') {
      iVar1 = this->numUsedBones;
      this->numUsedBones = iVar1 + 1;
      this->usedBones[iVar1] = (uint8)local_130;
    }
  }
  return;
}

Assistant:

void
Skin::findUsedBones(int32 numVertices)
{
	uint8 usedTab[256];
	uint8 *indices = this->indices;
	float *weights = this->weights;
	memset(usedTab, 0, 256);
	while(numVertices--){
		for(int32 i = 0; i < this->numWeights; i++){
			if(weights[i] == 0.0f)
				continue;	// TODO: this could probably be optimized
			if(usedTab[indices[i]] == 0)
				usedTab[indices[i]]++;
		}
		indices += 4;
		weights += 4;
	}
	this->numUsedBones = 0;
	for(int32 i = 0; i < 256; i++)
		if(usedTab[i])
			this->usedBones[this->numUsedBones++] = i;
}